

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_getParameterValueOfObjectType_Test::testBody
          (TEST_MockExpectedCall_getParameterValueOfObjectType_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  void *pvVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  MockNamedValue local_c8;
  SimpleString local_78;
  SimpleString local_68;
  undefined1 local_58 [8];
  TypeForTestingExpectedFunctionCall type;
  undefined1 local_28 [8];
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator;
  TEST_MockExpectedCall_getParameterValueOfObjectType_Test *this_local;
  
  TypeForTestingExpectedFunctionCallComparator::TypeForTestingExpectedFunctionCallComparator
            ((TypeForTestingExpectedFunctionCallComparator *)&repository.head_);
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28);
  SimpleString::SimpleString((SimpleString *)&type.value,"type");
  MockNamedValueComparatorsAndCopiersRepository::installComparator
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28,(SimpleString *)&type.value,
             (MockNamedValueComparator *)&repository.head_);
  SimpleString::~SimpleString((SimpleString *)&type.value);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)local_58,1);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_68,"type");
  SimpleString::SimpleString(&local_78,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&local_68,&local_78,local_58)
  ;
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_d8,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_c8,pMVar1,&local_d8);
  pvVar3 = MockNamedValue::getConstObjectPointer(&local_c8);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x13])
            (pUVar2,local_58,pvVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x18e,pTVar4);
  MockNamedValue::~MockNamedValue(&local_c8);
  SimpleString::~SimpleString(&local_d8);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_f8,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x29])(&local_e8,pMVar1,&local_f8);
  pcVar5 = SimpleString::asCharString(&local_e8);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"1",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,399,pTVar4);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString(&local_f8);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)local_58);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            ((MockNamedValueComparatorsAndCopiersRepository *)local_28);
  TypeForTestingExpectedFunctionCallComparator::~TypeForTestingExpectedFunctionCallComparator
            ((TypeForTestingExpectedFunctionCallComparator *)&repository.head_);
  return;
}

Assistant:

TEST(MockExpectedCall, getParameterValueOfObjectType)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1);
    call->withParameterOfType("type", "name", &type);
    POINTERS_EQUAL(&type, call->getInputParameter("name").getConstObjectPointer());
    STRCMP_EQUAL("1", call->getInputParameterValueString("name").asCharString());
}